

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pTextureFormatTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Performance::TextureFormatTests::init(TextureFormatTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 internalFormat;
  Context *context;
  _Alloc_hider description;
  _Alloc_hider name;
  int in_EAX;
  char *__s;
  Texture2DRenderCase *this_00;
  long lVar1;
  string descriptionBase;
  string nameBase;
  allocator<char> local_54 [36];
  
  for (lVar1 = 8; lVar1 != 0x318; lVar1 = lVar1 + 0x10) {
    internalFormat = *(deUint32 *)((long)&PTR_anon_var_dwarf_3206f1_01e46040 + lVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&nameBase,*(char **)(&UNK_01e46038 + lVar1),local_54);
    __s = glu::getTextureFormatName(internalFormat);
    std::__cxx11::string::string<std::allocator<char>>((string *)&descriptionBase,__s,local_54);
    this_00 = (Texture2DRenderCase *)operator_new(0x218);
    name = nameBase._M_dataplus;
    description = descriptionBase._M_dataplus;
    context = (this->super_TestCaseGroup).m_context;
    tcu::Matrix<float,_3,_3>::Matrix((Matrix<float,_3,_3> *)local_54);
    Texture2DRenderCase::Texture2DRenderCase
              (this_00,context,name._M_p,description._M_p,internalFormat,0x812f,0x812f,0x2600,0x2600
               ,(Mat3 *)local_54,1,false);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    std::__cxx11::string::~string((string *)&descriptionBase);
    in_EAX = std::__cxx11::string::~string((string *)&nameBase);
  }
  return in_EAX;
}

Assistant:

void TextureFormatTests::init (void)
{
	struct
	{
		const char*	name;
		deUint32	internalFormat;
	} texFormats[] =
	{
		{ "rgba32f",			GL_RGBA32F,			},
		{ "rgba32i",			GL_RGBA32I,			},
		{ "rgba32ui",			GL_RGBA32UI,		},
		{ "rgba16f",			GL_RGBA16F,			},
		{ "rgba16i",			GL_RGBA16I,			},
		{ "rgba16ui",			GL_RGBA16UI,		},
		{ "rgba8",				GL_RGBA8,			},
		{ "rgba8i",				GL_RGBA8I,			},
		{ "rgba8ui",			GL_RGBA8UI,			},
		{ "srgb8_alpha8",		GL_SRGB8_ALPHA8,	},
		{ "rgb10_a2",			GL_RGB10_A2,		},
		{ "rgb10_a2ui",			GL_RGB10_A2UI,		},
		{ "rgba4",				GL_RGBA4,			},
		{ "rgb5_a1",			GL_RGB5_A1,			},
		{ "rgba8_snorm",		GL_RGBA8_SNORM,		},
		{ "rgb8",				GL_RGB8,			},
		{ "rgb565",				GL_RGB565,			},
		{ "r11f_g11f_b10f",		GL_R11F_G11F_B10F,	},
		{ "rgb32f",				GL_RGB32F,			},
		{ "rgb32i",				GL_RGB32I,			},
		{ "rgb32ui",			GL_RGB32UI,			},
		{ "rgb16f",				GL_RGB16F,			},
		{ "rgb16i",				GL_RGB16I,			},
		{ "rgb16ui",			GL_RGB16UI,			},
		{ "rgb8_snorm",			GL_RGB8_SNORM,		},
		{ "rgb8i",				GL_RGB8I,			},
		{ "rgb8ui",				GL_RGB8UI,			},
		{ "srgb8",				GL_SRGB8,			},
		{ "rgb9_e5",			GL_RGB9_E5,			},
		{ "rg32f",				GL_RG32F,			},
		{ "rg32i",				GL_RG32I,			},
		{ "rg32ui",				GL_RG32UI,			},
		{ "rg16f",				GL_RG16F,			},
		{ "rg16i",				GL_RG16I,			},
		{ "rg16ui",				GL_RG16UI,			},
		{ "rg8",				GL_RG8,				},
		{ "rg8i",				GL_RG8I,			},
		{ "rg8ui",				GL_RG8UI,			},
		{ "rg8_snorm",			GL_RG8_SNORM,		},
		{ "r32f",				GL_R32F,			},
		{ "r32i",				GL_R32I,			},
		{ "r32ui",				GL_R32UI,			},
		{ "r16f",				GL_R16F,			},
		{ "r16i",				GL_R16I,			},
		{ "r16ui",				GL_R16UI,			},
		{ "r8",					GL_R8,				},
		{ "r8i",				GL_R8I,				},
		{ "r8ui",				GL_R8UI,			},
		{ "r8_snorm",			GL_R8_SNORM,		}
	};

	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(texFormats); formatNdx++)
	{
		deUint32	format			= texFormats[formatNdx].internalFormat;
		string		nameBase		= texFormats[formatNdx].name;
		deUint32	wrapS			= GL_CLAMP_TO_EDGE;
		deUint32	wrapT			= GL_CLAMP_TO_EDGE;
		deUint32	minFilter		= GL_NEAREST;
		deUint32	magFilter		= GL_NEAREST;
		int			numTextures		= 1;
		string		descriptionBase	= glu::getTextureFormatName(format);

		addChild(new Texture2DRenderCase(m_context, nameBase.c_str(), descriptionBase.c_str(), format, wrapS, wrapT, minFilter, magFilter, tcu::Mat3(), numTextures, false /* npot */));
	}
}